

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl.cxx
# Opt level: O1

int Fl::ready(void)

{
  int iVar1;
  int iVar2;
  long lVar3;
  fd_set *pfVar4;
  fd_set *pfVar5;
  byte bVar6;
  timeval tStack_198;
  fd_set fStack_188;
  fd_set fStack_108;
  fd_set fStack_88;
  
  bVar6 = 0;
  if (first_timeout == (Timeout *)0x0) {
    reset_clock = 0;
    iVar1 = fl_ready();
    return iVar1;
  }
  fStack_88.fds_bits[0xf] = 0x1a382c;
  elapse_timeouts();
  if (first_timeout->time <= 0.0) {
    return 1;
  }
  iVar1 = XQLength(fl_display);
  iVar2 = 1;
  if (iVar1 == 0) {
    if (nfds == 0) {
      iVar2 = 0;
    }
    else {
      tStack_198.tv_sec = 0;
      tStack_198.tv_usec = 0;
      pfVar4 = fdsets;
      pfVar5 = &fStack_188;
      for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
        pfVar5->fds_bits[0] = pfVar4->fds_bits[0];
        pfVar4 = (fd_set *)((long)pfVar4 + ((ulong)bVar6 * -2 + 1) * 8);
        pfVar5 = (fd_set *)((long)pfVar5 + ((ulong)bVar6 * -2 + 1) * 8);
      }
      pfVar4 = fdsets + 1;
      pfVar5 = &fStack_108;
      for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
        pfVar5->fds_bits[0] = pfVar4->fds_bits[0];
        pfVar4 = (fd_set *)((long)pfVar4 + ((ulong)bVar6 * -2 + 1) * 8);
        pfVar5 = (fd_set *)((long)pfVar5 + ((ulong)bVar6 * -2 + 1) * 8);
      }
      pfVar4 = fdsets + 2;
      pfVar5 = &fStack_88;
      for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
        pfVar5->fds_bits[0] = pfVar4->fds_bits[0];
        pfVar4 = (fd_set *)((long)pfVar4 + ((ulong)bVar6 * -2 + 1) * 8);
        pfVar5 = (fd_set *)((long)pfVar5 + ((ulong)bVar6 * -2 + 1) * 8);
      }
      iVar2 = select(maxfd + 1,&fStack_188,&fStack_108,&fStack_88,&tStack_198);
    }
  }
  return iVar2;
}

Assistant:

int Fl::ready() {
#if ! defined( WIN32 )  &&  ! defined(__APPLE__)
  if (first_timeout) {
    elapse_timeouts();
    if (first_timeout->time <= 0) return 1;
  } else {
    reset_clock = 1;
  }
#endif
  return fl_ready();
}